

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O0

packet_t * new_udp_pkt(char *src_ip,char *dst_ip,uint16_t src_port,uint16_t dst_port)

{
  uint16_t uVar1;
  double __x;
  double __x_00;
  packet_t *pkt;
  uint16_t dst_port_local;
  uint16_t src_port_local;
  char *dst_ip_local;
  char *src_ip_local;
  
  src_ip_local = (char *)parse_pkt(default_udp,0x2a);
  if ((packet_t *)src_ip_local == (packet_t *)0x0) {
    _log(__x);
    src_ip_local = (char *)0x0;
  }
  else if ((((packet_t *)src_ip_local)->eth_type == 0x800) &&
          (((packet_t *)src_ip_local)->ip != (ip_t *)0x0)) {
    inet_pton(2,src_ip,&((packet_t *)src_ip_local)->ip->src);
    inet_pton(2,dst_ip,&((packet_t *)src_ip_local)->ip->dst);
    if ((((packet_t *)src_ip_local)->ip_proto == '\x11') &&
       (((packet_t *)src_ip_local)->udp != (udp_t *)0x0)) {
      uVar1 = htons(src_port);
      ((packet_t *)src_ip_local)->udp->src = uVar1;
      uVar1 = htons(dst_port);
      ((packet_t *)src_ip_local)->udp->dst = uVar1;
    }
    else {
      _log(__x_00);
      free_pkt((packet_t *)src_ip_local);
      src_ip_local = (char *)0x0;
    }
  }
  else {
    _log(__x);
    free_pkt((packet_t *)src_ip_local);
    src_ip_local = (char *)0x0;
  }
  return (packet_t *)src_ip_local;
}

Assistant:

packet_t *new_udp_pkt(const char *src_ip, const char *dst_ip, uint16_t src_port, uint16_t dst_port)
{
	packet_t *pkt = parse_pkt(default_udp, sizeof(default_udp));

	if (pkt == NULL) {
		log_err("%s %d failed\n", __FUNCTION__, __LINE__);
		return NULL;
	}

	if (pkt->eth_type == ETH_IP && pkt->ip) {
		inet_pton(AF_INET, src_ip, (struct in_addr *)&pkt->ip->src);
		inet_pton(AF_INET, dst_ip, (struct in_addr *)&pkt->ip->dst);
	} else {
		log_err("%s %d failed\n", __FUNCTION__, __LINE__);
		free_pkt(pkt);
		return NULL;
	}

	if (pkt->ip_proto == IPPROTO_UDP && pkt->udp) {
		pkt->udp->src = htons(src_port);
		pkt->udp->dst = htons(dst_port);
	} else {
		log_err("%s %d failed\n", __FUNCTION__, __LINE__);
		free_pkt(pkt);
		return NULL;
	}

	return pkt;
}